

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmstr.cpp
# Opt level: O1

char * CVmObjString::cvt_int_to_str(char *buf,size_t buflen,int32_t inval,int radix,int flags)

{
  char cVar1;
  char cVar2;
  uint uVar3;
  ulong uVar4;
  size_t sVar5;
  size_t sVar6;
  
  uVar4 = (ulong)(uint)-inval;
  sVar5 = buflen;
  if ((flags & 1U) != 0 || -1 < inval) {
    uVar4 = (ulong)(uint)inval;
  }
  do {
    sVar6 = sVar5;
    sVar5 = sVar6 - 1;
    if (sVar6 == 0) goto LAB_002bf880;
    uVar3 = (uint)uVar4;
    cVar1 = (char)(uVar4 % (ulong)(uint)radix);
    cVar2 = '7';
    if (cVar1 < '\n') {
      cVar2 = '0';
    }
    buf[sVar6 - 1] = cVar2 + cVar1;
    uVar4 = uVar4 / (uint)radix;
  } while ((uint)radix <= uVar3);
  if ((flags & 1U) == 0 && -1 >= inval) {
    if (sVar5 == 0) goto LAB_002bf880;
    buf[sVar6 - 2] = '-';
    sVar5 = sVar6 - 2;
  }
  if (1 < (long)sVar5) {
    *(short *)(buf + (sVar5 - 2)) = (short)buflen - (short)sVar5;
    return buf + (sVar5 - 2);
  }
LAB_002bf880:
  err_throw(0x7d2);
}

Assistant:

char *CVmObjString::cvt_int_to_str(char *buf, size_t buflen,
                                   int32_t inval, int radix, int flags)
{
    int neg;
    uint32_t val;
    char *p;
    size_t len;

    /* start at the end of the buffer */
    p = buf + buflen;

    /* 
     *   if it's negative, and we're converting to a signed representation,
     *   use a leading minus sign plus the absolute value; otherwise, treat
     *   the value as unsigned 
     */
    if (inval >= 0 || (flags & TOSTR_UNSIGNED) != 0)
    {
        /* 
         *   the value is non-negative, either because the signed
         *   interpretation is non-negative or because we're using an
         *   unsigned interpretation (in which case there's no such thing as
         *   negative) 
         */
        neg = FALSE;

        /* use the value as-is */
        val = (uint32_t)inval;
    }
    else
    {   
        /* it's signed and negative - note that we need a minus sign */
        neg = TRUE;

        /* use the positive value for the conversion */
        val = (uint32_t)(-inval);
    }

    /* store numerals in reverse order */
    do
    {
        char c;

        /* if we have no more room, throw an error */
        if (p == buf)
            err_throw(VMERR_CONV_BUF_OVF);
        
        /* move on to the next available character in the buffer */
        --p;

        /* figure the character representation of this numeral */
        c = (char)(val % radix);
        if (c < 10)
            c += '0';
        else
            c += 'A' - 10;

        /* store the numeral at the current location */
        *p = c;

        /* divide the remaining number by the radix */
        val /= radix;
    } while (val != 0);

    /* store the leading minus sign if necessary */
    if (neg)
    {
        /* if we don't have room, throw an error */
        if (p == buf)
            err_throw(VMERR_CONV_BUF_OVF);

        /* move to the next byte */
        --p;

        /* store the minus sign */
        *p = '-';
    }

    /* calculate the length */
    len = buflen - (p - buf);

    /* make sure we have room for the length prefix */
    if (p < buf + 2)
        err_throw(VMERR_CONV_BUF_OVF);

    /* store the length prefix */
    p -= 2;
    vmb_put_len(p, len);

    /* return the pointer to the start of the number */
    return p;
}